

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  uint uVar1;
  BVH *bvh;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  byte bVar8;
  ushort uVar9;
  int iVar10;
  ushort uVar11;
  NodeRef root;
  size_t sVar12;
  long lVar13;
  byte bVar14;
  ulong uVar16;
  ulong uVar17;
  byte bVar18;
  NodeRef *pNVar19;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar20;
  undefined4 uVar21;
  uint uVar22;
  bool bVar23;
  ulong uVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar46;
  vint4 ai_2;
  vint4 bi;
  vint4 bi_1;
  undefined1 in_ZMM2 [64];
  vint4 bi_3;
  vint4 ai;
  vint4 bi_2;
  vint4 ai_1;
  vint4 ai_3;
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 in_ZMM31 [64];
  undefined1 auVar52 [64];
  Precalculations pre;
  TravRayK<4,_false> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  ushort uVar15;
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar26 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar30 = ZEXT816(0) << 0x40;
    uVar6 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar30,5);
    uVar24 = vpcmpeqd_avx512vl(auVar26,(undefined1  [16])valid_i->field_0);
    uVar24 = ((byte)uVar6 & 0xf) & uVar24;
    bVar8 = (byte)uVar24;
    if (bVar8 != 0) {
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar26 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar48 = ZEXT1664(auVar26);
      auVar27 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar26);
      auVar29._8_4_ = 0x219392ef;
      auVar29._0_8_ = 0x219392ef219392ef;
      auVar29._12_4_ = 0x219392ef;
      uVar25 = vcmpps_avx512vl(auVar27,auVar29,1);
      bVar23 = (bool)((byte)uVar25 & 1);
      auVar27._0_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * tray.dir.field_0._0_4_;
      bVar23 = (bool)((byte)(uVar25 >> 1) & 1);
      auVar27._4_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * tray.dir.field_0._4_4_;
      bVar23 = (bool)((byte)(uVar25 >> 2) & 1);
      auVar27._8_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * tray.dir.field_0._8_4_;
      bVar23 = (bool)((byte)(uVar25 >> 3) & 1);
      auVar27._12_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * tray.dir.field_0._12_4_;
      auVar28 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar26);
      uVar25 = vcmpps_avx512vl(auVar28,auVar29,1);
      bVar23 = (bool)((byte)uVar25 & 1);
      auVar28._0_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * tray.dir.field_0._16_4_;
      bVar23 = (bool)((byte)(uVar25 >> 1) & 1);
      auVar28._4_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * tray.dir.field_0._20_4_;
      bVar23 = (bool)((byte)(uVar25 >> 2) & 1);
      auVar28._8_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * tray.dir.field_0._24_4_;
      bVar23 = (bool)((byte)(uVar25 >> 3) & 1);
      auVar28._12_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * tray.dir.field_0._28_4_;
      auVar26 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar26);
      uVar25 = vcmpps_avx512vl(auVar26,auVar29,1);
      bVar23 = (bool)((byte)uVar25 & 1);
      auVar45._0_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * tray.dir.field_0._32_4_;
      bVar23 = (bool)((byte)(uVar25 >> 1) & 1);
      auVar45._4_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * tray.dir.field_0._36_4_;
      bVar23 = (bool)((byte)(uVar25 >> 2) & 1);
      auVar45._8_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * tray.dir.field_0._40_4_;
      bVar23 = (bool)((byte)(uVar25 >> 3) & 1);
      auVar45._12_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * tray.dir.field_0._44_4_;
      auVar29 = vrcp14ps_avx512vl(auVar27);
      auVar31._8_4_ = 0x3f800000;
      auVar31._0_8_ = &DAT_3f8000003f800000;
      auVar31._12_4_ = 0x3f800000;
      auVar26 = vfnmadd213ps_fma(auVar27,auVar29,auVar31);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar26,auVar29,auVar29)
      ;
      auVar27 = vrcp14ps_avx512vl(auVar28);
      auVar26 = vfnmadd213ps_fma(auVar28,auVar27,auVar31);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar26,auVar27,auVar27)
      ;
      auVar27 = vrcp14ps_avx512vl(auVar45);
      auVar26 = vfnmadd213ps_fma(auVar45,auVar27,auVar31);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar26,auVar27,auVar27)
      ;
      tray.org_rdir.field_0._0_4_ = (float)tray.org.field_0._0_4_ * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = (float)tray.org.field_0._4_4_ * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = (float)tray.org.field_0._8_4_ * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = (float)tray.org.field_0._12_4_ * tray.rdir.field_0._12_4_;
      uVar25 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar30,1);
      auVar26 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * auVar26._4_4_;
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar25 & 1) * auVar26._0_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * auVar26._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * auVar26._12_4_;
      uVar25 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar30,5);
      auVar26 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar23 = (bool)((byte)uVar25 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar23 * auVar26._0_4_ | (uint)!bVar23 * 0x30;
      bVar23 = (bool)((byte)(uVar25 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar23 * auVar26._4_4_ | (uint)!bVar23 * 0x30;
      bVar23 = (bool)((byte)(uVar25 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar23 * auVar26._8_4_ | (uint)!bVar23 * 0x30;
      bVar23 = (bool)((byte)(uVar25 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar23 * auVar26._12_4_ | (uint)!bVar23 * 0x30;
      uVar25 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar30,5);
      auVar26 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar23 = (bool)((byte)uVar25 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar23 * auVar26._0_4_ | (uint)!bVar23 * 0x50;
      bVar23 = (bool)((byte)(uVar25 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar23 * auVar26._4_4_ | (uint)!bVar23 * 0x50;
      bVar23 = (bool)((byte)(uVar25 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar23 * auVar26._8_4_ | (uint)!bVar23 * 0x50;
      bVar23 = (bool)((byte)(uVar25 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar23 * auVar26._12_4_ | (uint)!bVar23 * 0x50;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar50 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar26 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar30);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar8 & 1) * auVar26._0_4_ |
           (uint)!(bool)(bVar8 & 1) * stack_near[0].field_0._0_4_;
      bVar23 = (bool)((byte)(uVar24 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar23 * auVar26._4_4_ | (uint)!bVar23 * stack_near[0].field_0._4_4_;
      bVar23 = (bool)((byte)(uVar24 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar23 * auVar26._8_4_ | (uint)!bVar23 * stack_near[0].field_0._8_4_;
      bVar23 = SUB81(uVar24 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar23 * auVar26._12_4_ | (uint)!bVar23 * stack_near[0].field_0._12_4_;
      auVar26 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar49 = ZEXT1664(auVar26);
      auVar30 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar30);
      tray.tfar.field_0.i[0] =
           (uint)(bVar8 & 1) * auVar30._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar26._0_4_;
      bVar23 = (bool)((byte)(uVar24 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar23 * auVar30._4_4_ | (uint)!bVar23 * auVar26._4_4_;
      bVar23 = (bool)((byte)(uVar24 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar23 * auVar30._8_4_ | (uint)!bVar23 * auVar26._8_4_;
      bVar23 = SUB81(uVar24 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar23 * auVar30._12_4_ | (uint)!bVar23 * auVar26._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar22 = 3;
      }
      else {
        uVar22 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      uVar11 = (ushort)uVar24 ^ 0xf;
      pNVar19 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar20 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar26 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar51 = ZEXT1664(auVar26);
      auVar26 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
      auVar52 = ZEXT1664(auVar26);
LAB_00732c61:
      paVar20 = paVar20 + -1;
      root.ptr = pNVar19[-1].ptr;
      pNVar19 = pNVar19 + -1;
      if (root.ptr == 0xfffffffffffffff8) {
        iVar10 = 3;
      }
      else {
        aVar46 = *paVar20;
        uVar24 = vcmpps_avx512vl((undefined1  [16])aVar46,(undefined1  [16])tray.tfar.field_0,1);
        if ((char)uVar24 == '\0') {
          iVar10 = 2;
        }
        else {
          uVar21 = (undefined4)uVar24;
          iVar10 = 0;
          if ((uint)POPCOUNT(uVar21) <= uVar22) {
            do {
              sVar12 = 0;
              for (uVar25 = uVar24; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
                sVar12 = sVar12 + 1;
              }
              bVar23 = occluded1(This,bvh,root,sVar12,&pre,ray,&tray,context);
              bVar14 = (byte)(1 << ((uint)sVar12 & 0x1f));
              if (!bVar23) {
                bVar14 = 0;
              }
              bVar14 = (byte)uVar11 | bVar14;
              uVar11 = (ushort)bVar14;
              uVar24 = uVar24 - 1 & uVar24;
            } while (uVar24 != 0);
            if (bVar14 == 0xf) {
              iVar10 = 3;
            }
            else {
              auVar26 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              tray.tfar.field_0.i[0] =
                   (uint)(bVar14 & 1) * auVar26._0_4_ |
                   (uint)!(bool)(bVar14 & 1) * tray.tfar.field_0.i[0];
              bVar23 = (bool)(bVar14 >> 1 & 1);
              tray.tfar.field_0.i[1] =
                   (uint)bVar23 * auVar26._4_4_ | (uint)!bVar23 * tray.tfar.field_0.i[1];
              bVar23 = (bool)(bVar14 >> 2 & 1);
              tray.tfar.field_0.i[2] =
                   (uint)bVar23 * auVar26._8_4_ | (uint)!bVar23 * tray.tfar.field_0.i[2];
              bVar23 = (bool)(bVar14 >> 3 & 1);
              tray.tfar.field_0.i[3] =
                   (uint)bVar23 * auVar26._12_4_ | (uint)!bVar23 * tray.tfar.field_0.i[3];
              iVar10 = 2;
            }
            auVar26 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar48 = ZEXT1664(auVar26);
            auVar26 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar49 = ZEXT1664(auVar26);
            auVar26 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar50 = ZEXT1664(auVar26);
            auVar26 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar51 = ZEXT1664(auVar26);
            auVar26 = vxorps_avx512vl(auVar52._0_16_,auVar52._0_16_);
            auVar52 = ZEXT1664(auVar26);
          }
          auVar47 = ZEXT1664((undefined1  [16])aVar46);
          if (uVar22 < (uint)POPCOUNT(uVar21)) {
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_007330ea;
                uVar6 = vcmpps_avx512vl((undefined1  [16])tray.tfar.field_0,auVar47._0_16_,6);
                if ((char)uVar6 != '\0') {
                  uVar24 = (ulong)((uint)root.ptr & 0xf);
                  bVar14 = (byte)(uVar11 & 0xff0f);
                  if (uVar24 == 8) goto LAB_007330dd;
                  uVar9 = uVar11 & 0xff0f ^ 0xf;
                  auVar26 = *(undefined1 (*) [16])(ray + 0x50);
                  auVar30 = *(undefined1 (*) [16])(ray + 0x60);
                  auVar27 = *(undefined1 (*) [16])(ray + 0x40);
                  lVar13 = (root.ptr & 0xfffffffffffffff0) + 0x90;
                  uVar25 = 0;
                  goto LAB_00732eae;
                }
                iVar10 = 2;
                break;
              }
              auVar47 = ZEXT1664(auVar50._0_16_);
              sVar12 = 8;
              uVar24 = 0;
              do {
                sVar2 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + uVar24 * 8);
                if (sVar2 != 8) {
                  uVar21 = *(undefined4 *)(root.ptr + 0x20 + uVar24 * 4);
                  auVar41._4_4_ = uVar21;
                  auVar41._0_4_ = uVar21;
                  auVar41._8_4_ = uVar21;
                  auVar41._12_4_ = uVar21;
                  auVar27 = vfmsub132ps_fma(auVar41,(undefined1  [16])
                                                    tray.org_rdir.field_0.field_0.x.field_0,
                                            (undefined1  [16])tray.rdir.field_0.field_0.x.field_0);
                  auVar37._4_4_ = tray.org_rdir.field_0._20_4_;
                  auVar37._0_4_ = tray.org_rdir.field_0._16_4_;
                  auVar37._8_4_ = tray.org_rdir.field_0._24_4_;
                  auVar37._12_4_ = tray.org_rdir.field_0._28_4_;
                  uVar21 = *(undefined4 *)(root.ptr + 0x40 + uVar24 * 4);
                  auVar42._4_4_ = uVar21;
                  auVar42._0_4_ = uVar21;
                  auVar42._8_4_ = uVar21;
                  auVar42._12_4_ = uVar21;
                  auVar40._4_4_ = tray.org_rdir.field_0._36_4_;
                  auVar40._0_4_ = tray.org_rdir.field_0._32_4_;
                  auVar40._8_4_ = tray.org_rdir.field_0._40_4_;
                  auVar40._12_4_ = tray.org_rdir.field_0._44_4_;
                  uVar21 = *(undefined4 *)(root.ptr + 0x60 + uVar24 * 4);
                  auVar43._4_4_ = uVar21;
                  auVar43._0_4_ = uVar21;
                  auVar43._8_4_ = uVar21;
                  auVar43._12_4_ = uVar21;
                  auVar28 = vfmsub132ps_fma(auVar42,auVar37,
                                            (undefined1  [16])tray.rdir.field_0.field_0.y.field_0);
                  auVar45 = vfmsub132ps_fma(auVar43,auVar40,
                                            (undefined1  [16])tray.rdir.field_0.field_0.z.field_0);
                  uVar21 = *(undefined4 *)(root.ptr + 0x30 + uVar24 * 4);
                  auVar26._4_4_ = uVar21;
                  auVar26._0_4_ = uVar21;
                  auVar26._8_4_ = uVar21;
                  auVar26._12_4_ = uVar21;
                  auVar29 = vfmsub132ps_avx512vl
                                      ((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,
                                       (undefined1  [16])tray.org_rdir.field_0.field_0.x.field_0,
                                       auVar26);
                  uVar21 = *(undefined4 *)(root.ptr + 0x50 + uVar24 * 4);
                  auVar30._4_4_ = uVar21;
                  auVar30._0_4_ = uVar21;
                  auVar30._8_4_ = uVar21;
                  auVar30._12_4_ = uVar21;
                  auVar31 = vfmsub132ps_avx512vl
                                      ((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar37
                                       ,auVar30);
                  uVar21 = *(undefined4 *)(root.ptr + 0x70 + uVar24 * 4);
                  auVar35._4_4_ = uVar21;
                  auVar35._0_4_ = uVar21;
                  auVar35._8_4_ = uVar21;
                  auVar35._12_4_ = uVar21;
                  auVar32 = vfmsub132ps_avx512vl
                                      ((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar40
                                       ,auVar35);
                  auVar26 = vpminsd_avx(auVar27,auVar29);
                  auVar30 = vpminsd_avx(auVar28,auVar31);
                  auVar26 = vpmaxsd_avx(auVar26,auVar30);
                  auVar30 = vpminsd_avx(auVar45,auVar32);
                  auVar26 = vpmaxsd_avx(auVar26,auVar30);
                  auVar30 = vpmaxsd_avx(auVar27,auVar29);
                  auVar27 = vpmaxsd_avx(auVar28,auVar31);
                  auVar27 = vpminsd_avx(auVar30,auVar27);
                  auVar30 = vpmaxsd_avx(auVar45,auVar32);
                  auVar27 = vpminsd_avx(auVar27,auVar30);
                  auVar30 = vpmaxsd_avx(auVar26,(undefined1  [16])tray.tnear.field_0);
                  auVar27 = vpminsd_avx(auVar27,(undefined1  [16])tray.tfar.field_0);
                  uVar25 = vpcmpd_avx512vl(auVar30,auVar27,2);
                  uVar25 = uVar25 & 0xf;
                  if ((byte)uVar25 != 0) {
                    auVar30 = vblendmps_avx512vl(auVar50._0_16_,auVar26);
                    bVar23 = (bool)((byte)uVar25 & 1);
                    bVar3 = (bool)((byte)(uVar25 >> 1) & 1);
                    bVar4 = (bool)((byte)(uVar25 >> 2) & 1);
                    bVar5 = SUB81(uVar25 >> 3,0);
                    if (sVar12 != 8) {
                      pNVar19->ptr = sVar12;
                      pNVar19 = pNVar19 + 1;
                      *paVar20 = auVar47._0_16_;
                      paVar20 = paVar20 + 1;
                    }
                    auVar47 = ZEXT1664(CONCAT412((uint)bVar5 * auVar30._12_4_ |
                                                 (uint)!bVar5 * auVar26._12_4_,
                                                 CONCAT48((uint)bVar4 * auVar30._8_4_ |
                                                          (uint)!bVar4 * auVar26._8_4_,
                                                          CONCAT44((uint)bVar3 * auVar30._4_4_ |
                                                                   (uint)!bVar3 * auVar26._4_4_,
                                                                   (uint)bVar23 * auVar30._0_4_ |
                                                                   (uint)!bVar23 * auVar26._0_4_))))
                    ;
                    sVar12 = sVar2;
                  }
                }
              } while ((sVar2 != 8) && (bVar23 = uVar24 < 3, uVar24 = uVar24 + 1, bVar23));
              iVar10 = 0;
              if (sVar12 == 8) {
LAB_00732e26:
                bVar23 = false;
                iVar10 = 4;
              }
              else {
                uVar6 = vcmpps_avx512vl((undefined1  [16])auVar47._0_16_,
                                        (undefined1  [16])tray.tfar.field_0,9);
                bVar23 = true;
                if ((uint)POPCOUNT((int)uVar6) <= uVar22) {
                  pNVar19->ptr = sVar12;
                  pNVar19 = pNVar19 + 1;
                  *paVar20 = auVar47._0_16_;
                  paVar20 = paVar20 + 1;
                  goto LAB_00732e26;
                }
              }
              root.ptr = sVar12;
            } while (bVar23);
          }
        }
      }
      goto LAB_0073310b;
    }
  }
  return;
  while( true ) {
    uVar25 = uVar25 + 1;
    lVar13 = lVar13 + 0xb0;
    if (uVar24 - 8 <= uVar25) break;
LAB_00732eae:
    uVar16 = 0;
    uVar15 = uVar9;
    while( true ) {
      bVar14 = (byte)uVar15;
      uVar17 = (ulong)*(uint *)(lVar13 + uVar16 * 4);
      if (uVar17 == 0xffffffff) break;
      uVar21 = *(undefined4 *)(lVar13 + -0x90 + uVar16 * 4);
      auVar32._4_4_ = uVar21;
      auVar32._0_4_ = uVar21;
      auVar32._8_4_ = uVar21;
      auVar32._12_4_ = uVar21;
      uVar21 = *(undefined4 *)(lVar13 + -0x80 + uVar16 * 4);
      auVar33._4_4_ = uVar21;
      auVar33._0_4_ = uVar21;
      auVar33._8_4_ = uVar21;
      auVar33._12_4_ = uVar21;
      auVar28 = vsubps_avx(auVar32,*(undefined1 (*) [16])ray);
      auVar45 = vsubps_avx(auVar33,*(undefined1 (*) [16])(ray + 0x10));
      uVar21 = *(undefined4 *)(lVar13 + -0x70 + uVar16 * 4);
      auVar36._4_4_ = uVar21;
      auVar36._0_4_ = uVar21;
      auVar36._8_4_ = uVar21;
      auVar36._12_4_ = uVar21;
      auVar32 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar13 + -0x60 + uVar16 * 4)));
      auVar33 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar13 + -0x50 + uVar16 * 4)));
      auVar34 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar13 + -0x40 + uVar16 * 4)));
      auVar35 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar13 + -0x30 + uVar16 * 4)));
      auVar29 = vsubps_avx(auVar36,*(undefined1 (*) [16])(ray + 0x20));
      auVar36 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar13 + -0x20 + uVar16 * 4)));
      auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar13 + -0x10 + uVar16 * 4)));
      auVar31 = vmulss_avx512f(auVar33,auVar37);
      auVar38._0_4_ = auVar31._0_4_;
      auVar38._4_4_ = auVar38._0_4_;
      auVar38._8_4_ = auVar38._0_4_;
      auVar38._12_4_ = auVar38._0_4_;
      auVar38 = vfmsub231ps_avx512vl(auVar38,auVar36,auVar34);
      auVar31 = vmulss_avx512f(auVar34,auVar35);
      auVar39._0_4_ = auVar31._0_4_;
      auVar39._4_4_ = auVar39._0_4_;
      auVar39._8_4_ = auVar39._0_4_;
      auVar39._12_4_ = auVar39._0_4_;
      auVar39 = vfmsub231ps_avx512vl(auVar39,auVar37,auVar32);
      auVar31 = vmulss_avx512f(auVar32,auVar36);
      auVar31 = vbroadcastss_avx512vl(auVar31);
      auVar40 = vfmsub231ps_avx512vl(auVar31,auVar35,auVar33);
      auVar31 = vmulps_avx512vl(auVar26,auVar29);
      auVar41 = vfmsub231ps_avx512vl(auVar31,auVar45,auVar30);
      auVar31 = vmulps_avx512vl(auVar30,auVar28);
      auVar42 = vfmsub231ps_avx512vl(auVar31,auVar29,auVar27);
      auVar31 = vmulps_avx512vl(auVar27,auVar45);
      auVar43 = vfmsub231ps_avx512vl(auVar31,auVar28,auVar26);
      auVar31 = vmulps_avx512vl(auVar40,auVar30);
      auVar31 = vfmadd231ps_fma(auVar31,auVar39,auVar26);
      auVar31 = vfmadd231ps_fma(auVar31,auVar38,auVar27);
      auVar44 = vandps_avx512vl(auVar31,auVar51._0_16_);
      auVar37 = vmulps_avx512vl(auVar37,auVar43);
      auVar36 = vfmadd231ps_avx512vl(auVar37,auVar42,auVar36);
      auVar35 = vfmadd231ps_avx512vl(auVar36,auVar41,auVar35);
      auVar35 = vxorps_avx512vl(auVar44,auVar35);
      auVar36 = auVar52._0_16_;
      uVar6 = vcmpps_avx512vl(auVar35,auVar36,5);
      bVar18 = (byte)uVar6 & bVar14;
      if (bVar18 == 0) {
LAB_00732fb0:
        bVar18 = 0;
      }
      else {
        auVar34 = vmulps_avx512vl(auVar34,auVar43);
        auVar33 = vfmadd213ps_avx512vl(auVar42,auVar33,auVar34);
        auVar32 = vfmadd213ps_avx512vl(auVar41,auVar32,auVar33);
        auVar32 = vxorps_avx512vl(auVar44,auVar32);
        uVar6 = vcmpps_avx512vl(auVar32,auVar36,5);
        bVar18 = bVar18 & (byte)uVar6;
        if (bVar18 == 0) goto LAB_00732fb0;
        auVar37 = auVar48._0_16_;
        auVar33 = vandps_avx512vl(auVar31,auVar37);
        auVar34 = vsubps_avx512vl(auVar33,auVar35);
        uVar6 = vcmpps_avx512vl(auVar34,auVar32,5);
        bVar18 = bVar18 & (byte)uVar6;
        if (bVar18 == 0) {
LAB_0073304f:
          bVar18 = 0;
          auVar48 = ZEXT1664(auVar37);
          auVar28 = vxorps_avx512vl(auVar36,auVar36);
          auVar52 = ZEXT1664(auVar28);
        }
        else {
          auVar29 = vmulps_avx512vl(auVar40,auVar29);
          auVar45 = vfmadd213ps_fma(auVar45,auVar39,auVar29);
          auVar28 = vfmadd213ps_fma(auVar28,auVar38,auVar45);
          auVar28 = vxorps_avx512vl(auVar44,auVar28);
          auVar45 = vmulps_avx512vl(auVar33,*(undefined1 (*) [16])(ray + 0x30));
          auVar29 = vmulps_avx512vl(auVar33,*(undefined1 (*) [16])(ray + 0x80));
          uVar6 = vcmpps_avx512vl(auVar28,auVar29,2);
          uVar7 = vcmpps_avx512vl(auVar45,auVar28,1);
          bVar18 = bVar18 & (byte)uVar6 & (byte)uVar7;
          if (bVar18 == 0) goto LAB_0073304f;
          auVar28 = vxorps_avx512vl(auVar36,auVar36);
          auVar52 = ZEXT1664(auVar28);
          uVar6 = vcmpps_avx512vl(auVar31,auVar28,4);
          bVar18 = bVar18 & (byte)uVar6;
          auVar48 = ZEXT1664(auVar37);
        }
      }
      uVar1 = ((context->scene->geometries).items[uVar17].ptr)->mask;
      auVar34._4_4_ = uVar1;
      auVar34._0_4_ = uVar1;
      auVar34._8_4_ = uVar1;
      auVar34._12_4_ = uVar1;
      uVar6 = vptestmd_avx512vl(*(undefined1 (*) [16])(ray + 0x90),auVar34);
      bVar18 = (byte)uVar6 & 0xf & bVar18;
      bVar14 = bVar14 & (-(bVar18 == 0) | bVar18 ^ 0xf);
      uVar15 = (ushort)bVar14;
      if ((bVar14 == 0) || (bVar23 = 2 < uVar16, uVar16 = uVar16 + 1, bVar23)) break;
    }
    bVar14 = (byte)uVar9 & bVar14;
    uVar9 = (ushort)bVar14;
    if (bVar14 == 0) break;
  }
  bVar14 = bVar14 ^ 0xf;
LAB_007330dd:
  bVar14 = (byte)uVar11 | bVar14;
  uVar11 = (ushort)bVar14;
  if (bVar14 == 0xf) {
LAB_007330ea:
    iVar10 = 3;
  }
  else {
    auVar26 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    aVar46._0_4_ = (uint)(bVar14 & 1) * auVar26._0_4_ |
                   (uint)!(bool)(bVar14 & 1) * tray.tfar.field_0._0_4_;
    bVar23 = (bool)(bVar14 >> 1 & 1);
    aVar46._4_4_ = (uint)bVar23 * auVar26._4_4_ | (uint)!bVar23 * tray.tfar.field_0._4_4_;
    bVar23 = (bool)(bVar14 >> 2 & 1);
    aVar46._8_4_ = (uint)bVar23 * auVar26._8_4_ | (uint)!bVar23 * tray.tfar.field_0._8_4_;
    bVar23 = (bool)(bVar14 >> 3 & 1);
    aVar46._12_4_ = (uint)bVar23 * auVar26._12_4_ | (uint)!bVar23 * tray.tfar.field_0._12_4_;
    iVar10 = 0;
    tray.tfar.field_0 = aVar46;
  }
LAB_0073310b:
  if (iVar10 == 3) {
    bVar8 = (byte)uVar11 & bVar8;
    bVar23 = (bool)(bVar8 >> 1 & 1);
    bVar3 = (bool)(bVar8 >> 2 & 1);
    *(uint *)(ray + 0x80) =
         (uint)(bVar8 & 1) * auVar49._0_4_ | (uint)!(bool)(bVar8 & 1) * *(int *)(ray + 0x80);
    *(uint *)(ray + 0x84) = (uint)bVar23 * auVar49._4_4_ | (uint)!bVar23 * *(int *)(ray + 0x84);
    *(uint *)(ray + 0x88) = (uint)bVar3 * auVar49._8_4_ | (uint)!bVar3 * *(int *)(ray + 0x88);
    *(uint *)(ray + 0x8c) =
         (uint)(bVar8 >> 3) * auVar49._12_4_ | (uint)!(bool)(bVar8 >> 3) * *(int *)(ray + 0x8c);
    return;
  }
  goto LAB_00732c61;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }